

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * parse_string(cJSON *item,char *str,char **ep)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  size_t sVar12;
  
  if (*str == '\"') {
    pbVar8 = (byte *)(str + 1);
    sVar12 = 1;
    for (uVar10 = 1; (cVar1 = str[uVar10], cVar1 != '\0' && (cVar1 != '\"'));
        uVar10 = uVar10 + (cVar1 == '\\') + 1) {
      sVar12 = sVar12 + 1;
    }
    pbVar6 = (byte *)(*cJSON_malloc)(sVar12);
    if (pbVar6 != (byte *)0x0) {
      item->valuestring = (char *)pbVar6;
      item->type = 0x10;
      if (1 < uVar10) {
        pbVar11 = (byte *)(str + uVar10);
        do {
          if (*pbVar8 == 0x5c) {
            bVar2 = pbVar8[1];
            switch(bVar2) {
            case 0x6e:
              *pbVar6 = 10;
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
switchD_00103a2d_caseD_6f:
              *pbVar6 = bVar2;
              break;
            case 0x72:
              *pbVar6 = 0xd;
              break;
            case 0x74:
              *pbVar6 = 9;
              break;
            case 0x75:
              uVar4 = parse_hex4((char *)(pbVar8 + 2));
              pbVar9 = pbVar8 + 5;
              if (((pbVar11 <= pbVar9) || (uVar4 == 0)) || ((uVar4 & 0xfc00) == 0xdc00)) {
LAB_00103bb0:
                *ep = str;
                return (char *)0x0;
              }
              if ((uVar4 & 0xfc00) == 0xd800) {
                pbVar9 = pbVar8 + 0xb;
                if (((pbVar11 < pbVar9) || (pbVar8[6] != 0x5c)) ||
                   ((pbVar8[7] != 0x75 ||
                    (uVar5 = parse_hex4((char *)(pbVar8 + 8)), uVar5 - 0xe000 < 0xfffffc00))))
                goto LAB_00103bb0;
                pbVar6[3] = (byte)uVar5 & 0x3f | 0x80;
                uVar4 = (uVar4 & 0x3ff) * 0x400 + (uVar5 & 0x3c0) + 0x10000 >> 6;
                lVar3 = 4;
LAB_00103b5f:
                lVar7 = lVar3;
                pbVar6[2] = (byte)uVar4 & 0x3f | 0x80;
                uVar4 = uVar4 >> 6;
LAB_00103b71:
                pbVar6[1] = (byte)uVar4 & 0x3f | 0x80;
                uVar4 = uVar4 >> 6;
              }
              else {
                lVar7 = 1;
                if (0x7f < uVar4) {
                  lVar7 = 2;
                  lVar3 = 3;
                  if (0x7ff < uVar4) goto LAB_00103b5f;
                  goto LAB_00103b71;
                }
              }
              *pbVar6 = (byte)uVar4 | ""[lVar7];
              pbVar6 = pbVar6 + lVar7;
              goto LAB_00103b2d;
            default:
              if (bVar2 == 0x66) {
                *pbVar6 = 0xc;
              }
              else {
                if (bVar2 != 0x62) goto switchD_00103a2d_caseD_6f;
                *pbVar6 = 8;
              }
            }
            pbVar6 = pbVar6 + 1;
            pbVar9 = pbVar8 + 1;
          }
          else {
            *pbVar6 = *pbVar8;
            pbVar6 = pbVar6 + 1;
            pbVar9 = pbVar8;
          }
LAB_00103b2d:
          pbVar8 = pbVar9 + 1;
        } while (pbVar8 < pbVar11);
      }
      *pbVar6 = 0;
      return (char *)(pbVar8 + (*pbVar8 == 0x22));
    }
  }
  else {
    *ep = str;
  }
  return (char *)0x0;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str,const char **ep)
{
	const char *ptr=str+1,*end_ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {*ep=str;return 0;}	/* not a string! */
	
	while (*end_ptr!='\"' && *end_ptr && ++len) if (*end_ptr++ == '\\') end_ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	item->valuestring=out; /* assign here so out will be deleted during cJSON_Delete() later */
	item->type=cJSON_String;
	
	ptr=str+1;ptr2=out;
	while (ptr < end_ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					uc=parse_hex4(ptr+1);ptr+=4;	/* get the unicode char. */
					if (ptr >= end_ptr) {*ep=str;return 0;}	/* invalid */
					
					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)    {*ep=str;return 0;}	/* check for invalid.   */
					
					if (uc>=0xD800 && uc<=0xDBFF)	/* UTF16 surrogate pairs.	*/
					{
						if (ptr+6 > end_ptr)    {*ep=str;return 0;}	/* invalid */
						if (ptr[1]!='\\' || ptr[2]!='u')    {*ep=str;return 0;}	/* missing second-half of surrogate.    */
						uc2=parse_hex4(ptr+3);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)       {*ep=str;return 0;}	/* invalid second-half of surrogate.    */
						uc=0x10000 + (((uc&0x3FF)<<10) | (uc2&0x3FF));
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	return ptr;
}